

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void duckdb_je_arena_destroy(tsd_t *tsd,arena_t *arena)

{
  uint ind;
  tsdn_t *in_RSI;
  base_t *in_RDI;
  tsdn_t *unaff_retaddr;
  base_t *in_stack_00000100;
  tsd_t *in_stack_00000108;
  pa_shard_t *in_stack_ffffffffffffffd8;
  
  duckdb_je_pa_shard_destroy(in_RSI,in_stack_ffffffffffffffd8);
  ind = base_ind_get((base_t *)0x24b66c9);
  duckdb_je_arena_set(ind,(arena_t *)0x0);
  arena_prepare_base_deletion(in_stack_00000108,in_stack_00000100);
  duckdb_je_base_delete(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void
arena_destroy(tsd_t *tsd, arena_t *arena) {
	assert(base_ind_get(arena->base) >= narenas_auto);
	assert(arena_nthreads_get(arena, false) == 0);
	assert(arena_nthreads_get(arena, true) == 0);

	/*
	 * No allocations have occurred since arena_reset() was called.
	 * Furthermore, the caller (arena_i_destroy_ctl()) purged all cached
	 * extents, so only retained extents may remain and it's safe to call
	 * pa_shard_destroy_retained.
	 */
	pa_shard_destroy(tsd_tsdn(tsd), &arena->pa_shard);

	/*
	 * Remove the arena pointer from the arenas array.  We rely on the fact
	 * that there is no way for the application to get a dirty read from the
	 * arenas array unless there is an inherent race in the application
	 * involving access of an arena being concurrently destroyed.  The
	 * application must synchronize knowledge of the arena's validity, so as
	 * long as we use an atomic write to update the arenas array, the
	 * application will get a clean read any time after it synchronizes
	 * knowledge that the arena is no longer valid.
	 */
	arena_set(base_ind_get(arena->base), NULL);

	/*
	 * Destroy the base allocator, which manages all metadata ever mapped by
	 * this arena.  The prepare function will make sure no pending access to
	 * the metadata in this base anymore.
	 */
	arena_prepare_base_deletion(tsd, arena->base);
	base_delete(tsd_tsdn(tsd), arena->base);
}